

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int is_directed_automorphism(saucy *s)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (0 < s->ndiffs) {
    lVar3 = 0;
    do {
      iVar2 = s->unsupp[lVar3];
      iVar1 = check_mapping(s,s->adj,s->edg,iVar2);
      if ((iVar1 == 0) || (iVar2 = check_mapping(s,s->dadj,s->dedg,iVar2), iVar2 == 0)) {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < s->ndiffs);
  }
  return 1;
}

Assistant:

static int
is_directed_automorphism(struct saucy *s)
{
    int i, j;

    for (i = 0; i < s->ndiffs; ++i) {
        j = s->unsupp[i];
        if (!check_mapping(s, s->adj, s->edg, j)) return 0;
        if (!check_mapping(s, s->dadj, s->dedg, j)) return 0;
    }
    return 1;
}